

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::IfcSlab(IfcSlab *this)

{
  IfcSlab *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x180,"IfcSlab");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00eb6f30);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>,
             &PTR_construction_vtable_24__00eb7068);
  *(undefined8 *)this = 0xeb6e00;
  *(undefined8 *)&this->field_0x180 = 0xeb6f18;
  *(undefined8 *)&this->field_0x88 = 0xeb6e28;
  *(undefined8 *)&this->field_0x98 = 0xeb6e50;
  *(undefined8 *)&this->field_0xd0 = 0xeb6e78;
  *(undefined8 *)&this->field_0x100 = 0xeb6ea0;
  *(undefined8 *)&this->field_0x138 = 0xeb6ec8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xeb6ef0;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x10);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}